

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bif.c
# Opt level: O2

void bifyon(bifcxdef *ctx,int argc)

{
  char cVar1;
  int iVar2;
  int iVar3;
  ushort **ppuVar4;
  size_t sVar5;
  size_t sVar6;
  char *buf;
  runsdef val;
  char nobuf [64];
  char yesbuf [64];
  re_context rectx;
  char rsp [128];
  
  iVar2 = os_get_str_rsc(5,yesbuf,0x40);
  if (iVar2 != 0) {
    builtin_strncpy(yesbuf,"[Yy].*",7);
  }
  iVar2 = os_get_str_rsc(6,nobuf,0x40);
  if (iVar2 != 0) {
    builtin_strncpy(nobuf,"[Nn].*",7);
  }
  iVar2 = tio_is_html_mode();
  if (iVar2 != 0) {
    outformat("<font face=\'TADS-Input\'>");
  }
  outflushn(0);
  outreset();
  buf = rsp;
  iVar2 = getstring((char *)0x0,buf,0x80);
  if (iVar2 != 0) {
    ctx->bifcxrun->runcxerr->errcxptr->erraac = 0;
    runsign(ctx->bifcxrun,0x3f9);
  }
  iVar2 = tio_is_html_mode();
  if (iVar2 != 0) {
    outformat("</font>");
  }
  for (; cVar1 = *buf, -1 < (long)cVar1; buf = buf + 1) {
    ppuVar4 = __ctype_b_loc();
    if ((*(byte *)((long)*ppuVar4 + (long)cVar1 * 2 + 1) & 0x20) == 0) break;
  }
  re_init(&rectx,ctx->bifcxerr);
  sVar5 = strlen(yesbuf);
  sVar6 = strlen(buf);
  iVar2 = re_compile_and_match(&rectx,yesbuf,sVar5,buf,sVar6);
  sVar5 = strlen(nobuf);
  sVar6 = strlen(buf);
  iVar3 = re_compile_and_match(&rectx,nobuf,sVar5,buf,sVar6);
  sVar5 = strlen(buf);
  if (iVar2 == (int)sVar5) {
    val.runsv.runsvnum = 1;
  }
  else if (iVar3 == (int)sVar5) {
    val.runsv.runsvnum = 0;
  }
  else {
    val.runsv.runsvnum = -1;
  }
  re_delete(&rectx);
  runpush(ctx->bifcxrun,1,&val);
  return;
}

Assistant:

void bifyon(bifcxdef *ctx, int argc)
{
    char     rsp[128];
    char    *p;
    runsdef  val;
    char     yesbuf[64];
    char     nobuf[64];
    re_context  rectx;
    int      match_yes;
    int      match_no;

    bifcntargs(ctx, 0, argc);            /* check for proper argument count */

    /* load the "yes" and "no" reply patterns */
    if (os_get_str_rsc(RESID_YORN_YES, yesbuf, sizeof(yesbuf)))
        strcpy(yesbuf, "[Yy].*");
    if (os_get_str_rsc(RESID_YORN_NO, nobuf, sizeof(nobuf)))
        strcpy(nobuf, "[Nn].*");
    
    /* if we're in HTML mode, switch to input font */
    if (tio_is_html_mode())
        tioputs(ctx->bifcxtio, "<font face='TADS-Input'>");

    /* ensure the prompt is displayed */
    tioflushn(ctx->bifcxtio, 0);

    /* reset count of lines since the last keyboard input */
    tioreset(ctx->bifcxtio);

    /* read a line of text */
    if (tiogets(ctx->bifcxtio, (char *)0, rsp, (int)sizeof(rsp)))
        runsig(ctx->bifcxrun, ERR_RUNQUIT);

    /* if we're in HTML mode, close the input font tag */
    if (tio_is_html_mode())
        tioputs(ctx->bifcxtio, "</font>");

    /* scan off leading spaces */
    for (p = rsp ; t_isspace(*p) ; ++p) ;

    /* set up our regex context */
    re_init(&rectx, ctx->bifcxerr);

    /* check for a "yes" response */
    match_yes = re_compile_and_match(&rectx, yesbuf, strlen(yesbuf),
                                     p, strlen(p));

    /* check for a "no" response */
    match_no = re_compile_and_match(&rectx, nobuf, strlen(nobuf),
                                    p, strlen(p));

    /* check the result */
    if (match_yes == (int)strlen(p))
        val.runsv.runsvnum = 1;
    else if (match_no == (int)strlen(p))
        val.runsv.runsvnum = 0;
    else
        val.runsv.runsvnum = -1;

    /* delete our regex context */
    re_delete(&rectx);

    /* push the result */
    runpush(ctx->bifcxrun, DAT_NUMBER, &val);
}